

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Timers_InteractionList *timers_00;
  ostream *poVar1;
  InterpolationPoints elem_interp_pts;
  InterpolationPoints mol_interp_pts;
  Molecule molecule;
  Output output;
  InteractionList mol_elem_ilist;
  InteractionList elem_ilist;
  InteractionList mol_ilist;
  Params params;
  Tree elem_tree;
  Tree mol_tree;
  Elements elements;
  BoundaryElement boundary_element;
  Timers timers;
  
  if (1 < argc) {
    Params::Params(&params,argv[1]);
    memset(&timers,0,0x330);
    timers.tabipb.start_time_.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    Molecule::Molecule(&molecule,&params,&timers.molecule);
    Tree::Tree(&mol_tree,&molecule.super_Particles,params.tree_max_per_leaf_,&timers.tree);
    InterpolationPoints::InterpolationPoints(&mol_interp_pts,&mol_tree,params.tree_degree_);
    Molecule::build_xyzr_file(&molecule);
    Molecule::copyin_to_device(&molecule);
    InterpolationPoints::copyin_to_device(&mol_interp_pts);
    InterpolationPoints::compute_all_interp_pts(&mol_interp_pts);
    Elements::Elements(&elements,&molecule,&params,&timers.elements);
    Tree::Tree(&elem_tree,&elements.super_Particles,params.tree_max_per_leaf_,&timers.tree);
    InterpolationPoints::InterpolationPoints(&elem_interp_pts,&elem_tree,params.tree_degree_);
    Elements::copyin_to_device(&elements);
    InterpolationPoints::copyin_to_device(&elem_interp_pts);
    InterpolationPoints::compute_all_interp_pts(&elem_interp_pts);
    timers_00 = &timers.interaction_list;
    InteractionList::InteractionList
              (&mol_ilist,&mol_tree,params.tree_degree_,params.tree_theta_,timers_00);
    InteractionList::InteractionList
              (&elem_ilist,&elem_tree,params.tree_degree_,params.tree_theta_,timers_00);
    InteractionList::InteractionList
              (&mol_elem_ilist,&elem_tree,&mol_tree,params.tree_degree_,params.tree_theta_,timers_00
              );
    Elements::compute_source_term
              (&elements,&elem_interp_pts,&elem_tree,&molecule,&mol_interp_pts,&mol_tree,
               &mol_elem_ilist);
    Output::Output(&output,&molecule,&elements,&params,&timers.output);
    BoundaryElement::BoundaryElement
              (&boundary_element,&elements,&elem_interp_pts,&elem_tree,&elem_ilist,&molecule,&params
               ,&output,&timers.boundary_element);
    BoundaryElement::run_GMRES(&boundary_element);
    Output::compute_coulombic_energy(&output,&mol_interp_pts,&mol_tree,&mol_ilist);
    Output::compute_solvation_energy
              (&output,&elem_interp_pts,&elem_tree,&mol_interp_pts,&mol_tree,&mol_elem_ilist);
    Output::finalize(&output);
    Molecule::delete_from_device(&molecule);
    InterpolationPoints::delete_from_device(&mol_interp_pts);
    Elements::delete_from_device(&elements);
    InterpolationPoints::delete_from_device(&elem_interp_pts);
    Timer::stop(&timers.tabipb);
    Output::files(&output,&timers);
    BoundaryElement::~BoundaryElement(&boundary_element);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&output.potential_.super__Vector_base<double,_std::allocator<double>_>);
    InteractionList::~InteractionList(&mol_elem_ilist);
    InteractionList::~InteractionList(&elem_ilist);
    InteractionList::~InteractionList(&mol_ilist);
    InterpolationPoints::~InterpolationPoints(&elem_interp_pts);
    Tree::~Tree(&elem_tree);
    Elements::~Elements(&elements);
    InterpolationPoints::~InterpolationPoints(&mol_interp_pts);
    Tree::~Tree(&mol_tree);
    Molecule::~Molecule(&molecule);
    Params::~Params(&params);
    return 0;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"No input file set. Exiting.");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{
    // set the parameter struct, which is read in from file provided as argv
    if (argc < 2) { 
        std::cout << "No input file set. Exiting." << std::endl; 
        std::exit(1);
    }
    struct Params params(argv[1]);
    struct Timers timers;
    
    timers.tabipb.start();
    
    //construct the biomolecule from the provided pqr file
    class Molecule molecule(params, timers.molecule);
    class Tree mol_tree(molecule, params.tree_max_per_leaf_, timers.tree);
    class InterpolationPoints mol_interp_pts(mol_tree, params.tree_degree_);

    molecule.build_xyzr_file();
    molecule.copyin_to_device();
    mol_interp_pts.copyin_to_device();
    mol_interp_pts.compute_all_interp_pts();
    
    // build particles from a NanoShaper surface generated by xyzr file
    // then build a tree on the particles, partitioning them
    class Elements elements(molecule, params, timers.elements);
    class Tree elem_tree(elements, params.tree_max_per_leaf_, timers.tree);
    class InterpolationPoints elem_interp_pts(elem_tree, params.tree_degree_);
    
    elements.copyin_to_device();
    elem_interp_pts.copyin_to_device();
    elem_interp_pts.compute_all_interp_pts();

    class InteractionList mol_ilist(mol_tree, params.tree_degree_, params.tree_theta_,
                                    timers.interaction_list);
    class InteractionList elem_ilist(elem_tree, params.tree_degree_, params.tree_theta_,
                                    timers.interaction_list);
    class InteractionList mol_elem_ilist(elem_tree, mol_tree, params.tree_degree_, params.tree_theta_,
                                    timers.interaction_list);

    //elements.compute_source_term();
    elements.compute_source_term(elem_interp_pts, elem_tree, molecule, mol_interp_pts, mol_tree, mol_elem_ilist);
    
    
    /* energies, potential, and outfile routines are contained in output */
    class Output output(molecule, elements, params, timers.output);
    
    // initialize the boundary element method
    class BoundaryElement boundary_element(elements, elem_interp_pts, elem_tree, elem_ilist, molecule,
                                           params, output, timers.boundary_element);
    
    boundary_element.run_GMRES();

    //output.compute_coulombic_energy();
    //output.compute_solvation_energy();
    output.compute_coulombic_energy(mol_interp_pts, mol_tree, mol_ilist);
    output.compute_solvation_energy(elem_interp_pts, elem_tree, mol_interp_pts, mol_tree, mol_elem_ilist);
    output.finalize();

    molecule.delete_from_device();
    mol_interp_pts.delete_from_device();
    
    elements.delete_from_device();
    elem_interp_pts.delete_from_device();
    
    timers.tabipb.stop();
    
    output.files(timers);
    
    return 0;
}